

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O2

void __thiscall
PatternAddressMapper::compute_mapping_stats
          (PatternAddressMapper *this,
          vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>
          *agg_access_patterns,int *agg_intra_distance,int *agg_inter_distance,
          bool uses_seq_addresses)

{
  size_t sVar1;
  int iVar2;
  reference pvVar3;
  mapped_type *pmVar4;
  char *args;
  pointer pAVar5;
  pointer pAVar7;
  string local_80;
  string local_60;
  vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *local_40;
  vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *__range1;
  pointer pAVar6;
  
  local_40 = agg_access_patterns;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Deriving mapping parameters from AggressorAccessPatterns.",
             (allocator<char> *)&local_80);
  Logger::log_info(&local_60,true);
  std::__cxx11::string::~string((string *)&local_60);
  *agg_intra_distance = 0;
  pAVar5 = (local_40->
           super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
           _M_impl.super__Vector_impl_data._M_start;
  for (pAVar7 = pAVar5;
      pAVar7 != (local_40->
                super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>)
                ._M_impl.super__Vector_impl_data._M_finish; pAVar7 = pAVar7 + 1) {
    if (4 < (ulong)((long)(pAVar7->aggressors).
                          super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(pAVar7->aggressors).
                         super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
      pvVar3 = std::vector<Aggressor,_std::allocator<Aggressor>_>::at(&pAVar7->aggressors,1);
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->aggressor_to_addr,&pvVar3->id);
      sVar1 = pmVar4->row;
      pvVar3 = std::vector<Aggressor,_std::allocator<Aggressor>_>::at(&pAVar7->aggressors,0);
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->aggressor_to_addr,&pvVar3->id);
      *agg_intra_distance = (int)sVar1 - (int)pmVar4->row;
      pAVar5 = (local_40->
               super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
               _M_impl.super__Vector_impl_data._M_start;
      break;
    }
  }
  *agg_inter_distance = -1;
  do {
    while( true ) {
      pAVar6 = pAVar5 + 1;
      pAVar7 = (local_40->
               super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pAVar6 == pAVar7) goto LAB_00133d81;
      pvVar3 = std::vector<Aggressor,_std::allocator<Aggressor>_>::at
                         (&pAVar5->aggressors,
                          ((long)(pAVar5->aggressors).
                                 super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)(pAVar5->aggressors).
                                 super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2) - 1);
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->aggressor_to_addr,&pvVar3->id);
      sVar1 = pmVar4->row;
      pvVar3 = std::vector<Aggressor,_std::allocator<Aggressor>_>::at(&pAVar5[1].aggressors,0);
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->aggressor_to_addr,&pvVar3->id);
      iVar2 = (int)pmVar4->row - (int)sVar1;
      pAVar5 = pAVar6;
      if (*agg_inter_distance != -1) break;
      *agg_inter_distance = iVar2;
    }
  } while (*agg_inter_distance == iVar2);
LAB_00133d81:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"inter-distance v = %d",(allocator<char> *)((long)&__range1 + 7));
  format_string<int>(&local_60,&local_80,*agg_inter_distance);
  Logger::log_data(&local_60,true);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"intra-distance d = %d",(allocator<char> *)((long)&__range1 + 7));
  format_string<int>(&local_60,&local_80,*agg_intra_distance);
  Logger::log_data(&local_60,true);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"use_seq_addresses = %s",(allocator<char> *)((long)&__range1 + 7));
  args = "false";
  if (pAVar6 == pAVar7) {
    args = "true";
  }
  format_string<char_const*>(&local_60,&local_80,args);
  Logger::log_data(&local_60,true);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void PatternAddressMapper::compute_mapping_stats(std::vector<AggressorAccessPattern> &agg_access_patterns,
                                                 int &agg_intra_distance, int &agg_inter_distance,
                                                 bool uses_seq_addresses) {
  Logger::log_info("Deriving mapping parameters from AggressorAccessPatterns.");

  // find first AggressorAccessPattern with more than one aggressor, then compute distance in-between aggressors
  agg_intra_distance = 0;
  for (auto &agg_access_pattern : agg_access_patterns) {
    if (agg_access_pattern.aggressors.size() > 1) {
      auto r1 = aggressor_to_addr.at(agg_access_pattern.aggressors.at(1).id).row;
      auto r0 = aggressor_to_addr.at(agg_access_pattern.aggressors.at(0).id).row;
      agg_intra_distance = static_cast<int>(r1-r0);
      break;
    }
  }

  // if all consecutive AggressorAccessPatterns have the same inter-distance, then they use "sequential addresses"
  uses_seq_addresses = true;
  agg_inter_distance = -1;
  for (auto it = agg_access_patterns.begin(); it+1 != agg_access_patterns.end(); ++it) {
    auto this_size = it->aggressors.size();
    auto this_row = aggressor_to_addr.at(it->aggressors.at(this_size-1).id).row;
    auto next_row = aggressor_to_addr.at((it+1)->aggressors.at(0).id).row;
    auto distance = static_cast<int>(next_row - this_row);
    if (agg_inter_distance == -1) {
        agg_inter_distance = distance;
    } else if (agg_inter_distance != distance) {
      uses_seq_addresses = false;
      break;
    }
  }

  Logger::log_data(format_string("inter-distance v = %d", agg_inter_distance));
  Logger::log_data(format_string("intra-distance d = %d", agg_intra_distance));
  Logger::log_data(format_string("use_seq_addresses = %s", (uses_seq_addresses ? "true" : "false")));
}